

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap4_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_UInt32 local_1c;
  TT_CMap pTStack_18;
  FT_UInt32 char_code_local;
  TT_CMap cmap_local;
  
  if (char_code < 0x10000) {
    local_1c = char_code;
    pTStack_18 = cmap;
    if ((cmap->flags & 1U) == 0) {
      cmap_local._4_4_ = tt_cmap4_char_map_binary(cmap,&local_1c,'\0');
    }
    else {
      cmap_local._4_4_ = tt_cmap4_char_map_linear(cmap,&local_1c,'\0');
    }
  }
  else {
    cmap_local._4_4_ = 0;
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap4_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    if ( char_code >= 0x10000UL )
      return 0;

    if ( cmap->flags & TT_CMAP_FLAG_UNSORTED )
      return tt_cmap4_char_map_linear( cmap, &char_code, 0 );
    else
      return tt_cmap4_char_map_binary( cmap, &char_code, 0 );
  }